

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

void init_unpack(rar5 *rar)

{
  uint8_t *puVar1;
  rar5 *rar_local;
  
  (rar->file).calculated_crc32 = 0;
  init_window_mask(rar);
  free((rar->cstate).window_buf);
  free((rar->cstate).filtered_buf);
  if ((rar->cstate).window_size < 1) {
    (rar->cstate).window_buf = (uint8_t *)0x0;
    (rar->cstate).filtered_buf = (uint8_t *)0x0;
  }
  else {
    puVar1 = (uint8_t *)calloc(1,(rar->cstate).window_size);
    (rar->cstate).window_buf = puVar1;
    puVar1 = (uint8_t *)calloc(1,(rar->cstate).window_size);
    (rar->cstate).filtered_buf = puVar1;
  }
  (rar->cstate).write_ptr = 0;
  (rar->cstate).last_write_ptr = 0;
  memset(&(rar->cstate).bd,0,0xeec);
  memset(&(rar->cstate).ld,0,0xeec);
  memset(&(rar->cstate).dd,0,0xeec);
  memset(&(rar->cstate).ldd,0,0xeec);
  memset(&(rar->cstate).rd,0,0xeec);
  return;
}

Assistant:

static void init_unpack(struct rar5* rar) {
	rar->file.calculated_crc32 = 0;
	init_window_mask(rar);

	free(rar->cstate.window_buf);
	free(rar->cstate.filtered_buf);

	if(rar->cstate.window_size > 0) {
		rar->cstate.window_buf = calloc(1, rar->cstate.window_size);
		rar->cstate.filtered_buf = calloc(1, rar->cstate.window_size);
	} else {
		rar->cstate.window_buf = NULL;
		rar->cstate.filtered_buf = NULL;
	}

	rar->cstate.write_ptr = 0;
	rar->cstate.last_write_ptr = 0;

	memset(&rar->cstate.bd, 0, sizeof(rar->cstate.bd));
	memset(&rar->cstate.ld, 0, sizeof(rar->cstate.ld));
	memset(&rar->cstate.dd, 0, sizeof(rar->cstate.dd));
	memset(&rar->cstate.ldd, 0, sizeof(rar->cstate.ldd));
	memset(&rar->cstate.rd, 0, sizeof(rar->cstate.rd));
}